

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::StringPtr>_>::size
          (Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *this)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  size_t sVar3;
  ArrayPtr<const_char> *e;
  ArrayPtr<const_char> *__end0;
  ArrayPtr<const_char> *__begin0;
  Array<kj::ArrayPtr<const_char>_> *__range3;
  size_t sStack_18;
  bool first;
  size_t result;
  Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *this_local;
  
  ensureStringifiedInitialized(this);
  sStack_18 = 0;
  bVar1 = true;
  __end0 = Array<kj::ArrayPtr<const_char>_>::begin(&this->stringified);
  pAVar2 = Array<kj::ArrayPtr<const_char>_>::end(&this->stringified);
  for (; __end0 != pAVar2; __end0 = __end0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      sVar3 = StringPtr::size(&this->delimiter);
      sStack_18 = sVar3 + sStack_18;
    }
    sVar3 = ArrayPtr<const_char>::size(__end0);
    sStack_18 = sVar3 + sStack_18;
  }
  return sStack_18;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }